

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManRandomInfo(Vec_Ptr_t *vInfo,int iInputStart,int iWordStart,int iWordStop)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  
  for (; iInputStart < vInfo->nSize; iInputStart = iInputStart + 1) {
    pvVar2 = Vec_PtrEntry(vInfo,iInputStart);
    for (lVar3 = (long)iWordStart; lVar3 < iWordStop; lVar3 = lVar3 + 1) {
      uVar1 = Gia_ManRandom(0);
      *(uint *)((long)pvVar2 + lVar3 * 4) = uVar1;
    }
  }
  return;
}

Assistant:

void Gia_ManRandomInfo( Vec_Ptr_t * vInfo, int iInputStart, int iWordStart, int iWordStop )
{
    unsigned * pInfo;
    int i, w;
    Vec_PtrForEachEntryStart( unsigned *, vInfo, pInfo, i, iInputStart )
        for ( w = iWordStart; w < iWordStop; w++ )
            pInfo[w] = Gia_ManRandom(0);
}